

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
__thiscall duckdb::ParquetReader::ParseSchema(ParquetReader *this)

{
  _Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false> _Var1;
  pointer pcVar2;
  bool bVar3;
  ParquetFileMetadataCache *pPVar4;
  const_reference pvVar5;
  _func_int **pp_Var6;
  BinderException *this_00;
  IOException *pIVar7;
  InvalidInputException *this_01;
  pointer pPVar8;
  ParquetReader *in_RSI;
  char *__end;
  idx_t next_file_idx;
  idx_t next_schema_idx;
  ParquetColumnSchema root;
  idx_t local_160 [2];
  undefined1 local_150 [24];
  char local_138 [16];
  LogicalType local_128;
  _func_int *local_110;
  _func_int *p_Stack_108;
  _func_int *local_100;
  _func_int *p_Stack_f8;
  optional_idx local_f0;
  _func_int *p_Stack_e8;
  _func_int *local_e0;
  vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> local_d8;
  ParquetColumnSchema local_c0;
  
  pPVar4 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(&in_RSI->metadata);
  _Var1._M_head_impl =
       (pPVar4->metadata).
       super_unique_ptr<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
       ._M_t.
       super___uniq_ptr_impl<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_duckdb_parquet::FileMetaData_*,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
       .super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl;
  local_160[1] = 0;
  local_160[0] = 0;
  if (*(pointer *)
       &((_Var1._M_head_impl)->schema).
        super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
      == *(pointer *)((long)&(_Var1._M_head_impl)->schema + 8)) {
    pIVar7 = (IOException *)__cxa_allocate_exception(0x10);
    local_150._0_8_ = local_150 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"Parquet reader: no schema elements found","");
    IOException::IOException(pIVar7,(string *)local_150);
    __cxa_throw(pIVar7,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar5 = vector<duckdb_parquet::SchemaElement,_true>::operator[](&(_Var1._M_head_impl)->schema,0);
  if (pvVar5->num_children != 0) {
    ParseSchemaRecursive((ParquetColumnSchema *)local_150,in_RSI,0,0,0,local_160 + 1,local_160);
    if (local_128.id_ != STRUCT) {
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_c0._0_8_ = (long)&local_c0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Root element of Parquet file must be a struct","");
      InvalidInputException::InvalidInputException(this_01,(string *)&local_c0);
      __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((in_RSI->parquet_options).file_row_number == true) {
      if (local_d8.
          super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_d8.
          super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar2 = (pointer)((long)&local_c0 + 0x10);
        pPVar8 = local_d8.
                 super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_c0._0_8_ = pcVar2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"file_row_number","");
          bVar3 = StringUtil::CIEquals(&pPVar8->name,(string *)&local_c0);
          if ((pointer)local_c0._0_8_ != pcVar2) {
            operator_delete((void *)local_c0._0_8_);
          }
          if (bVar3) {
            this_00 = (BinderException *)__cxa_allocate_exception(0x10);
            local_c0._0_8_ = pcVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,
                       "Using file_row_number option on file with column named file_row_number is not supported"
                       ,"");
            BinderException::BinderException(this_00,(string *)&local_c0);
            __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pPVar8 = pPVar8 + 1;
        } while (pPVar8 != local_d8.
                           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      FileRowNumberSchema();
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      emplace_back<duckdb::ParquetColumnSchema>(&local_d8,&local_c0);
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      ~vector(&local_c0.children.
               super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             );
      LogicalType::~LogicalType(&local_c0.type);
      if (local_c0.name._M_dataplus._M_p != (pointer)((long)&local_c0 + 0x18U)) {
        operator_delete(local_c0.name._M_dataplus._M_p);
      }
    }
    pp_Var6 = (_func_int **)operator_new(0x90);
    *(undefined4 *)pp_Var6 = local_150._0_4_;
    pp_Var6[1] = (_func_int *)(pp_Var6 + 3);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(pp_Var6 + 1),local_150._8_8_,(char *)(local_150._8_8_ + local_150._16_8_))
    ;
    LogicalType::LogicalType((LogicalType *)(pp_Var6 + 5),&local_128);
    pp_Var6[0xe] = local_e0;
    pp_Var6[0xc] = (_func_int *)local_f0.index;
    pp_Var6[0xd] = p_Stack_e8;
    pp_Var6[10] = local_100;
    pp_Var6[0xb] = p_Stack_f8;
    pp_Var6[8] = local_110;
    pp_Var6[9] = p_Stack_108;
    ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::vector
              ((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *)
               (pp_Var6 + 0xf),&local_d8);
    (this->super_BaseFileReader)._vptr_BaseFileReader = pp_Var6;
    ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    ~vector(&local_d8);
    LogicalType::~LogicalType(&local_128);
    if ((char *)local_150._8_8_ != local_138) {
      operator_delete((void *)local_150._8_8_);
    }
    return (unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
            )(unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
              )this;
  }
  pIVar7 = (IOException *)__cxa_allocate_exception(0x10);
  local_150._0_8_ = local_150 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_150,"Parquet reader: root schema element has no children","");
  IOException::IOException(pIVar7,(string *)local_150);
  __cxa_throw(pIVar7,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ParquetColumnSchema> ParquetReader::ParseSchema() {
	auto file_meta_data = GetFileMetadata();
	idx_t next_schema_idx = 0;
	idx_t next_file_idx = 0;

	if (file_meta_data->schema.empty()) {
		throw IOException("Parquet reader: no schema elements found");
	}
	if (file_meta_data->schema[0].num_children == 0) {
		throw IOException("Parquet reader: root schema element has no children");
	}
	auto root = ParseSchemaRecursive(0, 0, 0, next_schema_idx, next_file_idx);
	if (root.type.id() != LogicalTypeId::STRUCT) {
		throw InvalidInputException("Root element of Parquet file must be a struct");
	}
	D_ASSERT(next_schema_idx == file_meta_data->schema.size() - 1);
	D_ASSERT(file_meta_data->row_groups.empty() || next_file_idx == file_meta_data->row_groups[0].columns.size());
	if (parquet_options.file_row_number) {
		for (auto &column : root.children) {
			auto &name = column.name;
			if (StringUtil::CIEquals(name, "file_row_number")) {
				throw BinderException(
				    "Using file_row_number option on file with column named file_row_number is not supported");
			}
		}
		root.children.push_back(FileRowNumberSchema());
	}
	return make_uniq<ParquetColumnSchema>(root);
}